

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallHeapBlockAllocator.cpp
# Opt level: O3

void __thiscall
Memory::
SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>::
SetNew(SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
       *this,SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *heapBlock)

{
  FreeObject *pFVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  
  if (this->endAddress != (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x96,"(this->endAddress == nullptr)","this->endAddress == nullptr");
    if (!bVar3) goto LAB_0073a821;
    *puVar5 = 0;
  }
  if (this->heapBlock != (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x97,"(this->heapBlock == nullptr)","this->heapBlock == nullptr");
    if (!bVar3) goto LAB_0073a821;
    *puVar5 = 0;
  }
  if (this->freeObjectList != (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x98,"(this->freeObjectList == nullptr)","this->freeObjectList == nullptr");
    if (!bVar3) goto LAB_0073a821;
    *puVar5 = 0;
  }
  if (heapBlock == (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x9a,"(heapBlock != nullptr)","heapBlock != nullptr");
    if (!bVar3) goto LAB_0073a821;
    *puVar5 = 0;
  }
  if ((heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.freeObjectList != (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x9b,"(heapBlock->freeObjectList == nullptr)",
                       "heapBlock->freeObjectList == nullptr");
    if (!bVar3) goto LAB_0073a821;
    *puVar5 = 0;
  }
  if ((heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.lastFreeCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x9c,"(heapBlock->lastFreeCount != 0)","heapBlock->lastFreeCount != 0");
    if (!bVar3) goto LAB_0073a821;
    *puVar5 = 0;
  }
  if ((heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.isInAllocator == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0x9e,"(!heapBlock->isInAllocator)","!heapBlock->isInAllocator");
    if (!bVar3) {
LAB_0073a821:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  (heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
  super_SmallHeapBlockT<MediumAllocationBlockAttributes>.isInAllocator = true;
  this->heapBlock = heapBlock;
  pFVar1 = (FreeObject *)
           (heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
           super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock.address;
  this->freeObjectList = pFVar1;
  uVar4 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetPageCount
                    ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock);
  this->endAddress = (char *)((long)&pFVar1->taggedNext + (ulong)(uVar4 << 0xc));
  return;
}

Assistant:

void
SmallHeapBlockAllocator<TBlockType>::SetNew(BlockType * heapBlock)
{
    Assert(this->endAddress == nullptr);
    Assert(this->heapBlock == nullptr);
    Assert(this->freeObjectList == nullptr);

    Assert(heapBlock != nullptr);
    Assert(heapBlock->freeObjectList == nullptr);
    Assert(heapBlock->lastFreeCount != 0);

    Assert(!heapBlock->isInAllocator);
    heapBlock->isInAllocator = true;

    this->heapBlock = heapBlock;
    this->freeObjectList = (FreeObject *)heapBlock->GetAddress();
    this->endAddress = heapBlock->GetEndAddress();

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP 
    DebugOnly(this->isAllocatingFromNewBlock = true);
#endif
}